

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int GetCoeffsAlt(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  byte bVar1;
  ulong *puVar2;
  VP8BandProbas *pVVar3;
  ushort uVar4;
  int iVar5;
  VP8ProbaArray *p;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bit_t bVar13;
  range_t range;
  uint uVar14;
  long lVar15;
  ushort local_4c;
  
  if (n < 0x10) {
    p = prob[n]->probas_ + ctx;
    uVar10 = br->range_;
    iVar5 = br->bits_;
    do {
      bVar1 = (*p)[0];
      if (iVar5 < 0) {
        puVar2 = (ulong *)br->buf_;
        if (puVar2 < br->buf_max_) {
          uVar6 = *puVar2;
          br->buf_ = (uint8_t *)((long)puVar2 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                        (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                        (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) >> 8;
          iVar5 = iVar5 + 0x38;
          br->bits_ = iVar5;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar5 = br->bits_;
        }
      }
      uVar8 = bVar1 * uVar10 >> 8;
      bVar13 = br->value_;
      uVar12 = (uint)(bVar13 >> ((byte)iVar5 & 0x3f));
      uVar14 = uVar8;
      if (uVar8 < uVar12) {
        bVar13 = bVar13 - ((ulong)uVar8 + 1 << ((byte)iVar5 & 0x3f));
        br->value_ = bVar13;
        uVar14 = ~uVar8 + uVar10;
      }
      if (uVar14 < 0x7f) {
        uVar6 = (ulong)uVar14;
        uVar14 = (uint)kVP8NewRange[uVar14];
        iVar5 = iVar5 - (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [uVar6];
        br->bits_ = iVar5;
      }
      br->range_ = uVar14;
      if (uVar12 <= uVar8) {
        return n;
      }
      lVar9 = (long)n;
      lVar15 = lVar9 << 0x20;
      while( true ) {
        n = n + 1;
        bVar1 = (*p)[1];
        if (iVar5 < 0) {
          puVar2 = (ulong *)br->buf_;
          if (puVar2 < br->buf_max_) {
            uVar6 = *puVar2;
            bVar13 = bVar13 << 0x38 |
                     ((uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                      (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                      (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) >> 8;
            br->buf_ = (uint8_t *)((long)puVar2 + 7);
            br->value_ = bVar13;
            iVar5 = iVar5 + 0x38;
            br->bits_ = iVar5;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar5 = br->bits_;
            bVar13 = br->value_;
          }
        }
        uVar8 = bVar1 * uVar14 >> 8;
        uVar12 = (uint)(bVar13 >> ((byte)iVar5 & 0x3f));
        uVar10 = uVar8;
        if (uVar8 < uVar12) {
          bVar13 = bVar13 - ((ulong)uVar8 + 1 << ((byte)iVar5 & 0x3f));
          br->value_ = bVar13;
          uVar10 = uVar14 + ~uVar8;
        }
        uVar14 = uVar10;
        if (uVar14 < 0x7f) {
          uVar6 = (ulong)uVar14;
          uVar14 = (uint)kVP8NewRange[uVar14];
          iVar5 = iVar5 - (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                [uVar6];
          br->bits_ = iVar5;
        }
        br->range_ = uVar14;
        if (uVar8 < uVar12) break;
        p = (VP8ProbaArray *)prob[lVar9 + 1];
        lVar9 = lVar9 + 1;
        lVar15 = lVar15 + 0x100000000;
        if (lVar9 == 0x10) {
          return 0x10;
        }
      }
      pVVar3 = prob[n];
      bVar1 = (*p)[2];
      iVar7 = br->bits_;
      if (iVar7 < 0) {
        puVar2 = (ulong *)br->buf_;
        if (puVar2 < br->buf_max_) {
          uVar6 = *puVar2;
          bVar13 = bVar13 << 0x38 |
                   ((uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                    (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                    (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) >> 8;
          br->buf_ = (uint8_t *)((long)puVar2 + 7);
          br->value_ = bVar13;
          iVar7 = iVar7 + 0x38;
          br->bits_ = iVar7;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar7 = br->bits_;
          bVar13 = br->value_;
        }
      }
      uVar8 = bVar1 * uVar14 >> 8;
      uVar12 = (uint)(bVar13 >> ((byte)iVar7 & 0x3f));
      uVar10 = uVar8;
      if (uVar8 < uVar12) {
        uVar10 = ~uVar8 + uVar14;
        br->value_ = bVar13 - ((ulong)uVar8 + 1 << ((byte)iVar7 & 0x3f));
      }
      if (uVar10 < 0x7f) {
        uVar6 = (ulong)uVar10;
        uVar10 = (uint)kVP8NewRange[uVar10];
        iVar7 = iVar7 - (uint)"\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [uVar6];
        br->bits_ = iVar7;
      }
      br->range_ = uVar10;
      if (uVar8 < uVar12) {
        iVar5 = GetLargeValue(br,*p);
        local_4c = (ushort)iVar5;
        p = pVVar3->probas_ + 2;
        iVar7 = br->bits_;
      }
      else {
        p = pVVar3->probas_ + 1;
        local_4c = 1;
      }
      if (iVar7 < 0) {
        puVar2 = (ulong *)br->buf_;
        if (puVar2 < br->buf_max_) {
          uVar6 = *puVar2;
          br->buf_ = (uint8_t *)((long)puVar2 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                        (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                        (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) >> 8;
          iVar7 = iVar7 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar7 = br->bits_;
        }
      }
      uVar12 = br->range_ >> 1;
      iVar11 = uVar12 - (int)(br->value_ >> ((byte)iVar7 & 0x3f));
      uVar14 = iVar11 >> 0x1f;
      iVar5 = iVar7 + -1;
      br->bits_ = iVar5;
      uVar10 = br->range_ + uVar14 | 1;
      br->range_ = uVar10;
      br->value_ = br->value_ - ((ulong)(uVar12 + 1 & uVar14) << ((byte)iVar7 & 0x3f));
      uVar4 = (ushort)(iVar11 >> 0x1f);
      out[""[lVar15 >> 0x20]] = ((local_4c ^ uVar4) - uVar4) * (short)dq[0 < lVar9];
    } while (lVar9 < 0xf);
  }
  return 0x10;
}

Assistant:

static int GetCoeffsAlt(VP8BitReader* const br,
                        const VP8BandProbas* const prob[],
                        int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas_[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBitAlt(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBitAlt(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas_[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas_[0];
      int v;
      if (!VP8GetBitAlt(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}